

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

ImageT<unsigned_char,_4U> * __thiscall
ImageT<unsigned_char,_4U>::swizzle(ImageT<unsigned_char,_4U> *this,string_view swizzle)

{
  Color *pCVar1;
  ulong uVar2;
  uchar uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  Color srcPixel;
  anon_union_4_2_6556a7fb_for_color<unsigned_char,_4U>_3 local_3c;
  ulong local_38;
  
  if (swizzle._M_len == 4) {
    if ((this->super_Image).height * (this->super_Image).width != 0) {
      local_38 = 0;
      do {
        local_3c = this->pixels[local_38].field_0;
        iVar4 = (*(this->super_Image)._vptr_Image[5])(this);
        uVar2 = local_38;
        if (iVar4 != 0) {
          uVar7 = 0;
          do {
            pCVar1 = this->pixels;
            uVar3 = swizzlePixel(this,(Color *)&local_3c.field_1,swizzle._M_str[uVar7]);
            uVar6 = 3;
            if ((uint)uVar7 < 3) {
              uVar6 = uVar7 & 0xffffffff;
            }
            pCVar1[uVar2].field_0.comps[uVar6] = uVar3;
            uVar7 = uVar7 + 1;
            uVar5 = (*(this->super_Image)._vptr_Image[5])(this);
          } while (uVar7 < uVar5);
        }
        local_38 = local_38 + 1;
      } while (local_38 < (this->super_Image).height * (this->super_Image).width);
    }
    return this;
  }
  __assert_fail("swizzle.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x4fe,
                "virtual ImageT<componentType, componentCount> &ImageT<unsigned char, 4>::swizzle(std::string_view) [componentType = unsigned char, componentCount = 4]"
               );
}

Assistant:

virtual ImageT& swizzle(std::string_view swizzle) override {
        assert(swizzle.size() == 4);
        for (size_t i = 0; i < getPixelCount(); i++) {
            Color srcPixel = pixels[i];
            for (uint32_t c = 0; c < getComponentCount(); c++) {
                pixels[i].set(c, swizzlePixel(srcPixel, swizzle[c]));
            }
        }
        return *this;
    }